

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_context.cpp
# Opt level: O1

bool __thiscall Clasp::SatPreprocessor::addClause(SatPreprocessor *this,Literal *lits,uint32 size)

{
  Clause *pCVar1;
  Clause *local_28;
  
  if (size < 2) {
    if (size != 1) {
      return false;
    }
    bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::push_back
              (&this->units_,lits);
  }
  else {
    pCVar1 = (Clause *)operator_new((ulong)(size - 1) * 4 + 0x10);
    *(uint32 *)&pCVar1->field_0x8 = size & 0x3fffffff;
    pCVar1->lits_[0].rep_ = 0;
    memcpy(pCVar1->lits_,lits,(ulong)size << 2);
    local_28 = pCVar1;
    bk_lib::
    pod_vector<Clasp::SatPreprocessor::Clause_*,_std::allocator<Clasp::SatPreprocessor::Clause_*>_>
    ::push_back(&this->clauses_,&local_28);
  }
  return true;
}

Assistant:

bool SatPreprocessor::addClause(const Literal* lits, uint32 size) {
	if (size > 1) {
		clauses_.push_back( Clause::newClause(lits, size) );
	}
	else if (size == 1) {
		units_.push_back(lits[0]);
	}
	else {
		return false;
	}
	return true;
}